

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalFederateId.hpp
# Opt level: O1

void __thiscall helics::MultiBroker::transmit(MultiBroker *this,route_id rid,ActionMessage *cmd)

{
  CommsInterface *pCVar1;
  pointer ppVar2;
  unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *puVar3;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *this_00;
  route_id rStack_4;
  
  if ((rid.rid == 0) ||
     ((this->comms).
      super__Vector_base<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->comms).
      super__Vector_base<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pCVar1 = (this->masterComm)._M_t.
             super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
             .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    if (pCVar1 != (CommsInterface *)0x0) {
      this_00 = &pCVar1->txQueue;
      if (cmd->messageAction < cmd_ignore) {
        gmlc::containers::
        BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
        ::emplacePriority<helics::route_id&,helics::ActionMessage_const&>
                  ((BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                    *)this_00,&rStack_4,cmd);
      }
      else {
        gmlc::containers::
        BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
        ::emplace<helics::route_id&,helics::ActionMessage_const&>
                  ((BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                    *)this_00,&rStack_4,cmd);
      }
      return;
    }
  }
  else {
    for (ppVar2 = (this->routingTable).
                  super__Vector_base<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar2 != (this->routingTable).
                  super__Vector_base<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
      if ((ppVar2->first).rid == rid.rid) {
        puVar3 = (this->comms).
                 super__Vector_base<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)ppVar2->second + -1;
        if ((long)ppVar2->second == 0) {
          puVar3 = &this->masterComm;
        }
        CommsInterface::transmit
                  ((puVar3->_M_t).
                   super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
                   .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,rid,cmd);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr bool operator==(route_id id) const noexcept { return (rid == id.rid); }